

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_ktx_texture.h
# Opt level: O3

void __thiscall
crnlib::ktx_texture::add_image
          (ktx_texture *this,uint face_index,uint mip_index,void *pImage,uint image_size)

{
  uint min_new_capacity;
  uint32 uVar1;
  uint32 uVar2;
  vector<unsigned_char> *pvVar3;
  void *p;
  uint uVar4;
  uint uVar5;
  ktx_image_data_vec *this_00;
  long lVar6;
  uint uVar7;
  
  uVar1 = (this->m_header).m_pixelDepth;
  uVar2 = (this->m_header).m_numberOfArrayElements;
  uVar7 = (mip_index * (this->m_header).m_numberOfFaces * (uVar2 + (uVar2 == 0)) + face_index) *
          (uVar1 + (uVar1 == 0));
  this_00 = &this->m_image_data;
  uVar4 = (this->m_image_data).m_size;
  if (uVar4 <= uVar7) {
    min_new_capacity = uVar7 + 1;
    uVar5 = uVar4 - min_new_capacity;
    if (uVar5 != 0) {
      if (uVar4 < min_new_capacity || uVar5 == 0) {
        if ((this->m_image_data).m_capacity < min_new_capacity) {
          elemental_vector::increase_capacity
                    ((elemental_vector *)this_00,min_new_capacity,uVar4 == uVar7,0x10,
                     (object_mover)0x0,false);
          uVar4 = (this->m_image_data).m_size;
        }
        if (min_new_capacity - uVar4 != 0) {
          memset(this_00->m_p + uVar4,0,(ulong)(min_new_capacity - uVar4) << 4);
        }
      }
      else {
        pvVar3 = this_00->m_p;
        lVar6 = 0;
        do {
          p = *(void **)((long)&pvVar3[min_new_capacity].m_p + lVar6);
          if (p != (void *)0x0) {
            crnlib_free(p);
          }
          lVar6 = lVar6 + 0x10;
        } while ((ulong)uVar5 << 4 != lVar6);
      }
      (this->m_image_data).m_size = min_new_capacity;
    }
  }
  if (image_size == 0) {
    return;
  }
  pvVar3 = this_00->m_p + uVar7;
  uVar4 = this_00->m_p[uVar7].m_size;
  if (uVar4 != image_size) {
    if (uVar4 <= image_size) {
      if (pvVar3->m_capacity < image_size) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)pvVar3,image_size,uVar4 + 1 == image_size,1,(object_mover)0x0
                   ,false);
        uVar4 = pvVar3->m_size;
      }
      memset(pvVar3->m_p + uVar4,0,(ulong)(image_size - uVar4));
    }
    pvVar3->m_size = image_size;
  }
  memcpy(pvVar3->m_p,pImage,(ulong)image_size);
  return;
}

Assistant:

void add_image(uint face_index, uint mip_index, const void* pImage, uint image_size)
        {
            const uint image_index = get_image_index(mip_index, 0, face_index, 0);
            if (image_index >= m_image_data.size())
            {
                m_image_data.resize(image_index + 1);
            }
            if (image_size)
            {
                uint8_vec& v = m_image_data[image_index];
                v.resize(image_size);
                memcpy(&v[0], pImage, image_size);
            }
        }